

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_internal.h
# Opt level: O1

void __thiscall
bssl::InplaceVector<NoSelfMove,_8UL>::Shrink(InplaceVector<NoSelfMove,_8UL> *this,size_t new_size)

{
  char *pcVar1;
  size_t sVar2;
  ulong uVar3;
  
  uVar3 = (ulong)this->size_;
  if (uVar3 < new_size) {
    abort();
  }
  sVar2 = new_size;
  if (uVar3 != new_size) {
    do {
      if (*(void **)(this->storage_ + sVar2 * 8) != (void *)0x0) {
        operator_delete(*(void **)(this->storage_ + sVar2 * 8),4);
      }
      pcVar1 = this->storage_ + sVar2 * 8;
      pcVar1[0] = '\0';
      pcVar1[1] = '\0';
      pcVar1[2] = '\0';
      pcVar1[3] = '\0';
      pcVar1[4] = '\0';
      pcVar1[5] = '\0';
      pcVar1[6] = '\0';
      pcVar1[7] = '\0';
      sVar2 = sVar2 + 1;
    } while (uVar3 != sVar2);
  }
  this->size_ = (PackedSize<8UL>)new_size;
  return;
}

Assistant:

void Shrink(size_t new_size) {
    BSSL_CHECK(new_size <= size_);
    std::destroy_n(data() + new_size, size_ - new_size);
    size_ = static_cast<PackedSize<N>>(new_size);
  }